

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-rinex.c
# Opt level: O0

int read_file(coda_product *product)

{
  int iVar1;
  coda_type_record_field *pcVar2;
  long lVar3;
  coda_type_array *pcVar4;
  coda_type_record *pcVar5;
  undefined1 local_160 [8];
  ingest_info info;
  coda_mem_record *root_type;
  coda_type_record *definition;
  coda_type_record_field *field;
  coda_type_array *records_definition;
  coda_product *product_local;
  
  info.time_system_corr_array = (coda_mem_array *)0x0;
  ingest_info_init((ingest_info *)local_160);
  info.f = (FILE *)product;
  local_160 = (undefined1  [8])fopen(product->filename,"r");
  if (local_160 == (undefined1  [8])0x0) {
    coda_set_error(-0x15,"could not open file %s",product->filename);
    product_local._4_4_ = -1;
  }
  else {
    iVar1 = read_main_header((ingest_info *)local_160);
    if (iVar1 == 0) {
      if (info.format_version._0_1_ == 'O') {
        info.offset = (long)coda_type_record_new(coda_format_rinex);
        pcVar2 = coda_type_record_field_new("epoch");
        lVar3 = __tls_get_addr(&PTR_00246d10);
        coda_type_record_field_set_type(pcVar2,*(coda_type **)(*(long *)(lVar3 + 0x1118) + 0x168));
        coda_type_record_add_field((coda_type_record *)info.offset,pcVar2);
        pcVar2 = coda_type_record_field_new("flag");
        lVar3 = __tls_get_addr(&PTR_00246d10);
        coda_type_record_field_set_type(pcVar2,*(coda_type **)(*(long *)(lVar3 + 0x1118) + 0x170));
        coda_type_record_add_field((coda_type_record *)info.offset,pcVar2);
        pcVar2 = coda_type_record_field_new("receiver_clock_offset");
        lVar3 = __tls_get_addr(&PTR_00246d10);
        coda_type_record_field_set_type(pcVar2,*(coda_type **)(*(long *)(lVar3 + 0x1118) + 0x178));
        coda_type_record_add_field((coda_type_record *)info.offset,pcVar2);
        iVar1 = read_observation_header((ingest_info *)local_160);
        if (iVar1 != 0) {
          ingest_info_cleanup((ingest_info *)local_160);
          return -1;
        }
        iVar1 = coda_mem_record_validate((coda_mem_record *)info.product);
        if (iVar1 != 0) {
          ingest_info_cleanup((ingest_info *)local_160);
          return -1;
        }
        pcVar4 = coda_type_array_new(coda_format_rinex);
        coda_type_array_add_variable_dimension(pcVar4,(coda_expression *)0x0);
        coda_type_array_set_base_type(pcVar4,(coda_type *)info.offset);
        info.sys_array = coda_mem_array_new(pcVar4,(coda_dynamic_type *)0x0);
        coda_type_release((coda_type *)pcVar4);
        iVar1 = read_observation_records((ingest_info *)local_160);
        if (iVar1 != 0) {
          ingest_info_cleanup((ingest_info *)local_160);
          return -1;
        }
        pcVar5 = coda_type_record_new(coda_format_rinex);
        info.time_system_corr_array =
             (coda_mem_array *)coda_mem_record_new(pcVar5,(coda_dynamic_type *)0x0);
        coda_type_release((coda_type *)pcVar5);
        coda_mem_record_add_field
                  ((coda_mem_record *)info.time_system_corr_array,"header",
                   (coda_dynamic_type *)info.product,1);
        info.product = (coda_product *)0x0;
        coda_mem_record_add_field
                  ((coda_mem_record *)info.time_system_corr_array,"record",
                   (coda_dynamic_type *)info.sys_array,1);
        info.sys_array = (coda_mem_array *)0x0;
      }
      else if (info.format_version._0_1_ == 'N') {
        info.offset = (long)coda_type_record_new(coda_format_rinex);
        pcVar2 = coda_type_record_field_new("epoch");
        lVar3 = __tls_get_addr(&PTR_00246d10);
        coda_type_record_field_set_type(pcVar2,*(coda_type **)(*(long *)(lVar3 + 0x1118) + 0x168));
        coda_type_record_add_field((coda_type_record *)info.offset,pcVar2);
        pcVar2 = coda_type_record_field_new("flag");
        lVar3 = __tls_get_addr(&PTR_00246d10);
        coda_type_record_field_set_type(pcVar2,*(coda_type **)(*(long *)(lVar3 + 0x1118) + 0x170));
        coda_type_record_add_field((coda_type_record *)info.offset,pcVar2);
        pcVar2 = coda_type_record_field_new("receiver_clock_offset");
        lVar3 = __tls_get_addr(&PTR_00246d10);
        coda_type_record_field_set_type(pcVar2,*(coda_type **)(*(long *)(lVar3 + 0x1118) + 0x178));
        coda_type_record_add_field((coda_type_record *)info.offset,pcVar2);
        iVar1 = read_navigation_header((ingest_info *)local_160);
        if (iVar1 != 0) {
          ingest_info_cleanup((ingest_info *)local_160);
          return -1;
        }
        iVar1 = coda_mem_record_validate((coda_mem_record *)info.product);
        if (iVar1 != 0) {
          ingest_info_cleanup((ingest_info *)local_160);
          return -1;
        }
        lVar3 = __tls_get_addr(&PTR_00246d10);
        info.gps.sat_obs_array =
             coda_mem_array_new(*(coda_type_array **)(*(long *)(lVar3 + 0x1118) + 0x400),
                                (coda_dynamic_type *)0x0);
        lVar3 = __tls_get_addr(&PTR_00246d10);
        info.glonass.sat_obs_array =
             coda_mem_array_new(*(coda_type_array **)(*(long *)(lVar3 + 0x1118) + 0x408),
                                (coda_dynamic_type *)0x0);
        lVar3 = __tls_get_addr(&PTR_00246d10);
        info.galileo.sat_obs_array =
             coda_mem_array_new(*(coda_type_array **)(*(long *)(lVar3 + 0x1118) + 0x410),
                                (coda_dynamic_type *)0x0);
        lVar3 = __tls_get_addr(&PTR_00246d10);
        info.sbas.sat_obs_array =
             coda_mem_array_new(*(coda_type_array **)(*(long *)(lVar3 + 0x1118) + 0x418),
                                (coda_dynamic_type *)0x0);
        iVar1 = read_navigation_records((ingest_info *)local_160);
        if (iVar1 != 0) {
          ingest_info_cleanup((ingest_info *)local_160);
          return -1;
        }
        lVar3 = __tls_get_addr(&PTR_00246d10);
        info.time_system_corr_array =
             (coda_mem_array *)
             coda_mem_record_new(*(coda_type_record **)(*(long *)(lVar3 + 0x1118) + 0x420),
                                 (coda_dynamic_type *)0x0);
        coda_mem_record_add_field
                  ((coda_mem_record *)info.time_system_corr_array,"header",
                   (coda_dynamic_type *)info.product,0);
        info.product = (coda_product *)0x0;
        coda_mem_record_add_field
                  ((coda_mem_record *)info.time_system_corr_array,"gps",
                   (coda_dynamic_type *)info.gps.sat_obs_array,0);
        info.gps.sat_obs_array = (coda_mem_array *)0x0;
        coda_mem_record_add_field
                  ((coda_mem_record *)info.time_system_corr_array,"glonass",
                   (coda_dynamic_type *)info.glonass.sat_obs_array,0);
        info.glonass.sat_obs_array = (coda_mem_array *)0x0;
        coda_mem_record_add_field
                  ((coda_mem_record *)info.time_system_corr_array,"galileo",
                   (coda_dynamic_type *)info.galileo.sat_obs_array,0);
        info.galileo.sat_obs_array = (coda_mem_array *)0x0;
        coda_mem_record_add_field
                  ((coda_mem_record *)info.time_system_corr_array,"sbas",
                   (coda_dynamic_type *)info.sbas.sat_obs_array,0);
        info.sbas.sat_obs_array = (coda_mem_array *)0x0;
      }
      else {
        iVar1 = read_clock_header((ingest_info *)local_160);
        if (iVar1 != 0) {
          ingest_info_cleanup((ingest_info *)local_160);
          return -1;
        }
        iVar1 = coda_mem_record_validate((coda_mem_record *)info.product);
        if (iVar1 != 0) {
          ingest_info_cleanup((ingest_info *)local_160);
          return -1;
        }
        pcVar4 = coda_type_array_new(coda_format_rinex);
        coda_type_array_add_variable_dimension(pcVar4,(coda_expression *)0x0);
        lVar3 = __tls_get_addr(&PTR_00246d10);
        coda_type_array_set_base_type(pcVar4,*(coda_type **)(*(long *)(lVar3 + 0x1118) + 0x478));
        info.sys_array = coda_mem_array_new(pcVar4,(coda_dynamic_type *)0x0);
        coda_type_release((coda_type *)pcVar4);
        iVar1 = read_clock_records((ingest_info *)local_160);
        if (iVar1 != 0) {
          ingest_info_cleanup((ingest_info *)local_160);
          return -1;
        }
        pcVar5 = coda_type_record_new(coda_format_rinex);
        info.time_system_corr_array =
             (coda_mem_array *)coda_mem_record_new(pcVar5,(coda_dynamic_type *)0x0);
        coda_type_release((coda_type *)pcVar5);
        coda_mem_record_add_field
                  ((coda_mem_record *)info.time_system_corr_array,"header",
                   (coda_dynamic_type *)info.product,1);
        info.product = (coda_product *)0x0;
        coda_mem_record_add_field
                  ((coda_mem_record *)info.time_system_corr_array,"record",
                   (coda_dynamic_type *)info.sys_array,1);
        info.sys_array = (coda_mem_array *)0x0;
      }
      product->root_type = (coda_dynamic_type *)info.time_system_corr_array;
      ingest_info_cleanup((ingest_info *)local_160);
      product_local._4_4_ = 0;
    }
    else {
      ingest_info_cleanup((ingest_info *)local_160);
      product_local._4_4_ = -1;
    }
  }
  return product_local._4_4_;
}

Assistant:

static int read_file(coda_product *product)
{
    coda_type_array *records_definition;
    coda_type_record_field *field;
    coda_type_record *definition;
    coda_mem_record *root_type = NULL;
    ingest_info info;

    ingest_info_init(&info);
    info.product = product;

    info.f = fopen(product->filename, "r");
    if (info.f == NULL)
    {
        coda_set_error(CODA_ERROR_FILE_OPEN, "could not open file %s", product->filename);
        return -1;
    }

    if (read_main_header(&info) != 0)
    {
        ingest_info_cleanup(&info);
        return -1;
    }

    if (info.file_type == 'O')
    {
        info.epoch_record_definition = coda_type_record_new(coda_format_rinex);
        field = coda_type_record_field_new("epoch");
        coda_type_record_field_set_type(field, rinex_type[rinex_obs_epoch]);
        coda_type_record_add_field(info.epoch_record_definition, field);
        field = coda_type_record_field_new("flag");
        coda_type_record_field_set_type(field, rinex_type[rinex_obs_epoch_flag]);
        coda_type_record_add_field(info.epoch_record_definition, field);
        field = coda_type_record_field_new("receiver_clock_offset");
        coda_type_record_field_set_type(field, rinex_type[rinex_receiver_clock_offset]);
        coda_type_record_add_field(info.epoch_record_definition, field);

        if (read_observation_header(&info) != 0)
        {
            ingest_info_cleanup(&info);
            return -1;
        }
        if (coda_mem_record_validate(info.header) != 0)
        {
            ingest_info_cleanup(&info);
            return -1;
        }

        /* create /record array */
        records_definition = coda_type_array_new(coda_format_rinex);
        coda_type_array_add_variable_dimension((coda_type_array *)records_definition, NULL);
        coda_type_array_set_base_type(records_definition, (coda_type *)info.epoch_record_definition);
        info.records = coda_mem_array_new(records_definition, NULL);
        coda_type_release((coda_type *)records_definition);

        if (read_observation_records(&info) != 0)
        {
            ingest_info_cleanup(&info);
            return -1;
        }

        /* create root record */
        definition = coda_type_record_new(coda_format_rinex);
        root_type = coda_mem_record_new(definition, NULL);
        coda_type_release((coda_type *)definition);
        coda_mem_record_add_field(root_type, "header", (coda_dynamic_type *)info.header, 1);
        info.header = NULL;
        coda_mem_record_add_field(root_type, "record", (coda_dynamic_type *)info.records, 1);
        info.records = NULL;
    }
    else if (info.file_type == 'N')
    {
        info.epoch_record_definition = coda_type_record_new(coda_format_rinex);
        field = coda_type_record_field_new("epoch");
        coda_type_record_field_set_type(field, rinex_type[rinex_obs_epoch]);
        coda_type_record_add_field(info.epoch_record_definition, field);
        field = coda_type_record_field_new("flag");
        coda_type_record_field_set_type(field, rinex_type[rinex_obs_epoch_flag]);
        coda_type_record_add_field(info.epoch_record_definition, field);
        field = coda_type_record_field_new("receiver_clock_offset");
        coda_type_record_field_set_type(field, rinex_type[rinex_receiver_clock_offset]);
        coda_type_record_add_field(info.epoch_record_definition, field);

        if (read_navigation_header(&info) != 0)
        {
            ingest_info_cleanup(&info);
            return -1;
        }
        if (coda_mem_record_validate(info.header) != 0)
        {
            ingest_info_cleanup(&info);
            return -1;
        }

        info.gps.records = coda_mem_array_new((coda_type_array *)rinex_type[rinex_nav_gps_array], NULL);
        info.glonass.records = coda_mem_array_new((coda_type_array *)rinex_type[rinex_nav_glonass_array], NULL);
        info.galileo.records = coda_mem_array_new((coda_type_array *)rinex_type[rinex_nav_galileo_array], NULL);
        info.sbas.records = coda_mem_array_new((coda_type_array *)rinex_type[rinex_nav_sbas_array], NULL);

        if (read_navigation_records(&info) != 0)
        {
            ingest_info_cleanup(&info);
            return -1;
        }

        /* create root record */
        root_type = coda_mem_record_new((coda_type_record *)rinex_type[rinex_nav_file], NULL);
        coda_mem_record_add_field(root_type, "header", (coda_dynamic_type *)info.header, 0);
        info.header = NULL;
        coda_mem_record_add_field(root_type, "gps", (coda_dynamic_type *)info.gps.records, 0);
        info.gps.records = NULL;
        coda_mem_record_add_field(root_type, "glonass", (coda_dynamic_type *)info.glonass.records, 0);
        info.glonass.records = NULL;
        coda_mem_record_add_field(root_type, "galileo", (coda_dynamic_type *)info.galileo.records, 0);
        info.galileo.records = NULL;
        coda_mem_record_add_field(root_type, "sbas", (coda_dynamic_type *)info.sbas.records, 0);
        info.sbas.records = NULL;
    }
    else        /* file_type == 'C' */
    {
        if (read_clock_header(&info) != 0)
        {
            ingest_info_cleanup(&info);
            return -1;
        }
        if (coda_mem_record_validate(info.header) != 0)
        {
            ingest_info_cleanup(&info);
            return -1;
        }

        /* create /record array */
        records_definition = coda_type_array_new(coda_format_rinex);
        coda_type_array_add_variable_dimension((coda_type_array *)records_definition, NULL);
        coda_type_array_set_base_type(records_definition, rinex_type[rinex_clk_record]);
        info.records = coda_mem_array_new(records_definition, NULL);
        coda_type_release((coda_type *)records_definition);

        if (read_clock_records(&info) != 0)
        {
            ingest_info_cleanup(&info);
            return -1;
        }

        /* create root record */
        definition = coda_type_record_new(coda_format_rinex);
        root_type = coda_mem_record_new(definition, NULL);
        coda_type_release((coda_type *)definition);
        coda_mem_record_add_field(root_type, "header", (coda_dynamic_type *)info.header, 1);
        info.header = NULL;
        coda_mem_record_add_field(root_type, "record", (coda_dynamic_type *)info.records, 1);
        info.records = NULL;
    }

    product->root_type = (coda_dynamic_type *)root_type;

    ingest_info_cleanup(&info);

    return 0;
}